

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

void __thiscall
cmArchiveWrite::cmArchiveWrite(cmArchiveWrite *this,ostream *os,Compress c,string *format)

{
  string *this_00;
  int iVar1;
  archive *paVar2;
  string local_50;
  
  this->Stream = os;
  paVar2 = archive_write_new();
  this->Archive = paVar2;
  paVar2 = archive_read_disk_new();
  this->Disk = paVar2;
  this->Verbose = false;
  this_00 = &this->Error;
  (this->Error)._M_dataplus._M_p = (pointer)&(this->Error).field_2;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  (this->MTime)._M_dataplus._M_p = (pointer)&(this->MTime).field_2;
  (this->MTime)._M_string_length = 0;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  switch(c) {
  case CompressNone:
    iVar1 = archive_write_set_compression_none(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7c60);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      goto LAB_002df11e;
    }
    break;
  case CompressCompress:
    iVar1 = archive_write_set_compression_compress(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7c85);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      goto LAB_002df11e;
    }
    break;
  case CompressGZip:
    iVar1 = archive_write_set_compression_gzip(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7cae);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      goto LAB_002df11e;
    }
    break;
  case CompressBZip2:
    iVar1 = archive_write_set_compression_bzip2(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7cd3);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      goto LAB_002df11e;
    }
    break;
  case CompressLZMA:
    iVar1 = archive_write_set_compression_lzma(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7cf9);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      goto LAB_002df11e;
    }
    break;
  case CompressXZ:
    iVar1 = archive_write_set_compression_xz(this->Archive);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7d1e);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      goto LAB_002df11e;
    }
  }
  iVar1 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar1 == 0) {
    iVar1 = archive_write_set_format_by_name(this->Archive,(format->_M_dataplus)._M_p);
    if (iVar1 == 0) {
      iVar1 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar1 == 0) {
        iVar1 = archive_write_open(this->Archive,this,(undefined1 *)0x0,Callback::Write,
                                   (undefined1 *)0x0);
        if (iVar1 == 0) {
          return;
        }
        std::__cxx11::string::operator=((string *)this_00,"archive_write_open: ");
        cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
        std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7d8c);
        cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
        std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7d69);
      cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x4b7d41);
    cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_50._M_dataplus._M_p);
  }
LAB_002df11e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(
  std::ostream& os, Compress c, std::string const& format):
    Stream(os),
    Archive(archive_write_new()),
    Disk(archive_read_disk_new()),
    Verbose(false)
{
  switch (c)
    {
    case CompressNone:
      if(archive_write_set_compression_none(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_none: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressCompress:
      if(archive_write_set_compression_compress(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_compress: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressGZip:
      if(archive_write_set_compression_gzip(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_gzip: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressBZip2:
      if(archive_write_set_compression_bzip2(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_bzip2: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressLZMA:
      if(archive_write_set_compression_lzma(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_lzma: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    case CompressXZ:
      if(archive_write_set_compression_xz(this->Archive) != ARCHIVE_OK)
        {
        this->Error = "archive_write_set_compression_xz: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
        }
      break;
    };
#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_set_standard_lookup: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }
#endif

  if(archive_write_set_format_by_name(this->Archive, format.c_str())
    != ARCHIVE_OK)
    {
    this->Error = "archive_write_set_format_by_name: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1))
    {
    this->Error = "archive_write_set_bytes_in_last_block: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }

  if(archive_write_open(
       this->Archive, this, 0,
       reinterpret_cast<archive_write_callback*>(&Callback::Write),
       0) != ARCHIVE_OK)
    {
    this->Error = "archive_write_open: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
    }
}